

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cpp
# Opt level: O3

void __thiscall App::setup(App *this)

{
  int iVar1;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"data/spritesheet.json","");
  piksel::Spritesheet::load(&this->spritesheet,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  Character::setup(&this->character,&this->spritesheet,(this->super_BaseApp).height);
  initBricks(this);
  iVar1 = piksel::BaseApp::millis(&this->super_BaseApp);
  piksel::Timer::reset(&this->enemySpawnTimer,iVar1);
  iVar1 = piksel::BaseApp::millis(&this->super_BaseApp);
  Ball::setup(&this->ball,iVar1);
  return;
}

Assistant:

void App::setup() {
    spritesheet.load("data/spritesheet.json");
    character.setup(spritesheet, height);
    initBricks();
    enemySpawnTimer.reset(millis());
    ball.setup(millis());
}